

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTSerializer.cpp
# Opt level: O0

void __thiscall
slang::ast::ASTSerializer::visit<slang::ast::ConditionalAssertionExpr>
          (ASTSerializer *this,ConditionalAssertionExpr *elem,bool inMembersArray)

{
  size_t sVar1;
  byte in_DL;
  long in_RSI;
  ASTSerializer *in_RDI;
  string_view sVar2;
  SourceLocation end;
  SourceLocation start;
  SourceRange sr;
  SourceManager *sm;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffee0;
  int __fd;
  JsonWriter *in_stack_fffffffffffffef0;
  void *local_108;
  SourceLocation in_stack_ffffffffffffff00;
  int __fd_00;
  SourceLocation in_stack_ffffffffffffff08;
  void *local_f0;
  SourceLocation in_stack_ffffffffffffff18;
  ConditionalAssertionExpr *in_stack_ffffffffffffff20;
  void *local_d8;
  int local_c8;
  SourceManager *in_stack_ffffffffffffff40;
  SourceLocation location;
  int local_b0;
  SourceManager *in_stack_ffffffffffffff58;
  SourceLocation in_stack_ffffffffffffff60;
  SourceLocation this_00;
  SourceLocation location_00;
  int local_88;
  void *local_80;
  size_t local_70;
  int local_60;
  void *local_58;
  SourceRange local_30;
  SourceManager *local_20;
  byte local_11;
  long local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  JsonWriter::startObject(in_stack_fffffffffffffef0);
  __fd = (int)in_stack_fffffffffffffef0;
  if (((*(long *)(local_10 + 8) != 0) && ((in_RDI->includeSourceInfo & 1U) != 0)) &&
     (local_20 = Compilation::getSourceManager(in_RDI->compilation),
     local_20 != (SourceManager *)0x0)) {
    local_30 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_ffffffffffffff20);
    SourceRange::start(&local_30);
    in_stack_ffffffffffffff18 =
         SourceManager::getFullyExpandedLoc
                   ((SourceManager *)in_stack_ffffffffffffff00,in_stack_ffffffffffffff08);
    SourceRange::end(&local_30);
    in_stack_ffffffffffffff00 =
         SourceManager::getFullyExpandedLoc
                   ((SourceManager *)in_stack_ffffffffffffff00,in_stack_ffffffffffffff08);
    __fd_00 = in_stack_ffffffffffffff08._0_4_;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffee0,(char *)in_RDI);
    sVar2 = SourceManager::getFileName(in_stack_ffffffffffffff58,in_stack_ffffffffffffff60);
    local_70 = sVar2._M_len;
    write(in_RDI,local_60,local_58,local_70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffee0,(char *)in_RDI);
    this_00 = in_stack_ffffffffffffff00;
    sVar2 = SourceManager::getFileName(in_stack_ffffffffffffff58,in_stack_ffffffffffffff00);
    location_00 = (SourceLocation)sVar2._M_len;
    write(in_RDI,local_88,local_80,(size_t)location_00);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffee0,(char *)in_RDI);
    location = in_stack_ffffffffffffff18;
    sVar1 = SourceManager::getLineNumber((SourceManager *)this_00,location_00);
    write(in_RDI,local_b0,in_stack_ffffffffffffff58,sVar1);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffee0,(char *)in_RDI);
    sVar1 = SourceManager::getLineNumber((SourceManager *)this_00,location_00);
    write(in_RDI,local_c8,in_stack_ffffffffffffff40,sVar1);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffee0,(char *)in_RDI);
    sVar1 = SourceManager::getColumnNumber(in_stack_ffffffffffffff40,location);
    write(in_RDI,(int)in_stack_ffffffffffffff20,local_d8,sVar1);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffee0,(char *)in_RDI);
    sVar1 = SourceManager::getColumnNumber(in_stack_ffffffffffffff40,location);
    write(in_RDI,__fd_00,local_f0,sVar1);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffee0,(char *)in_RDI);
  sVar2 = ast::toString(Invalid);
  write(in_RDI,__fd,local_108,sVar2._M_len);
  ConditionalAssertionExpr::serializeTo
            (in_stack_ffffffffffffff20,(ASTSerializer *)in_stack_ffffffffffffff18);
  JsonWriter::endObject((JsonWriter *)in_stack_ffffffffffffff00);
  return;
}

Assistant:

void ASTSerializer::visit(const T& elem, bool inMembersArray) {
    if constexpr (std::is_base_of_v<Expression, T> || std::is_base_of_v<Statement, T> ||
                  std::is_base_of_v<TimingControl, T> || std::is_base_of_v<Constraint, T> ||
                  std::is_base_of_v<AssertionExpr, T> || std::is_base_of_v<BinsSelectExpr, T> ||
                  std::is_base_of_v<Pattern, T>) {
        writer.startObject();
        if (elem.syntax && includeSourceInfo) {
            if (auto sm = compilation.getSourceManager()) {
                auto sr = elem.syntax->sourceRange();
                auto start = sm->getFullyExpandedLoc(sr.start());
                auto end = sm->getFullyExpandedLoc(sr.end());
                write("source_file_start", sm->getFileName(start));
                write("source_file_end", sm->getFileName(end));
                write("source_line_start", sm->getLineNumber(start));
                write("source_line_end", sm->getLineNumber(end));
                write("source_column_start", sm->getColumnNumber(start));
                write("source_column_end", sm->getColumnNumber(end));
            }
        }
    }
    if constexpr (std::is_base_of_v<Expression, T>) {
        write("kind", toString(elem.kind));
        write("type", *elem.type);
        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (!std::is_same_v<Expression, T>) {
            elem.serializeTo(*this);
        }

        if (tryConstantFold) {
            ASTContext ctx(compilation.getRoot(), LookupLocation::max);
            ConstantValue constant = ctx.tryEval(elem);
            if (constant)
                write("constant", constant);
        }
        else if (elem.constant) {
            write("constant", *elem.constant);
        }

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<Statement, T>) {
        write("kind", toString(elem.kind));

        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (!std::is_same_v<Statement, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<TimingControl, T> || std::is_base_of_v<Constraint, T> ||
                       std::is_base_of_v<AssertionExpr, T> ||
                       std::is_base_of_v<BinsSelectExpr, T> || std::is_base_of_v<Pattern, T>) {
        write("kind", toString(elem.kind));
        if constexpr (!std::is_same_v<TimingControl, T> && !std::is_same_v<Constraint, T> &&
                      !std::is_same_v<AssertionExpr, T> && !std::is_same_v<BinsSelectExpr, T> &&
                      !std::is_same_v<Pattern, T>) {
            elem.serializeTo(*this);
        }
        writer.endObject();
    }
    else {
        if constexpr (std::is_base_of_v<Type, T>) {
            // If we're not including detailed type info, we can just write the type name,
            // unless this a type alias, class, or covergroup. Otherwise we will fall through
            // and serialize full detailed type info.
            if (!detailedTypeInfo && (!inMembersArray || (!std::is_same_v<TypeAliasType, T> &&
                                                          !std::is_same_v<ClassType, T> &&
                                                          !std::is_same_v<CovergroupType, T>))) {
                writer.writeValue(elem.toString());
                return;
            }

            // Avoid infinite loops with recursive types.
            if (!visiting.insert(&elem).second) {
                writer.writeValue(elem.toString());
                return;
            }
        }

        // Skip uninstantiated blocks and instances.
        if constexpr (std::is_same_v<InstanceSymbol, T> ||
                      std::is_same_v<CheckerInstanceSymbol, T>) {
            if (elem.body.flags.has(InstanceFlags::Uninstantiated))
                return;
        }
        else if constexpr (std::is_same_v<GenerateBlockArraySymbol, T>) {
            if (!elem.valid)
                return;
        }
        else if constexpr (std::is_same_v<GenerateBlockSymbol, T>) {
            if (elem.isUninstantiated)
                return;
        }

        // Ignore built-in methods on class types.
        if constexpr (std::is_same_v<SubroutineSymbol, T>) {
            if (elem.flags.has(MethodFlags::BuiltIn | MethodFlags::Randomize))
                return;
        }

        // Ignore transparent members.
        if (elem.kind == SymbolKind::TransparentMember)
            return;

        writer.startObject();
        write("name", elem.name);
        write("kind", toString(elem.kind));
        if (includeSourceInfo) {
            if (auto sm = compilation.getSourceManager()) {
                write("source_file", sm->getFileName(elem.location));
                write("source_line", sm->getLineNumber(elem.location));
                write("source_column", sm->getColumnNumber(elem.location));
            }
        }

        if (includeAddrs)
            write("addr", uintptr_t(&elem));

        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (std::is_base_of_v<ValueSymbol, T>) {
            if (elem.kind != SymbolKind::EnumValue)
                write("type", elem.getType());

            if (auto init = elem.getInitializer())
                write("initializer", *init);
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            if (!elem.empty()) {
                startArray("members");
                for (auto& member : elem.members())
                    serialize(member, /* inMembersArray */ true);
                endArray();
            }
        }

        if constexpr (!std::is_same_v<Symbol, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();

        if constexpr (std::is_base_of_v<Type, T>) {
            visiting.erase(&elem);
        }
    }
}